

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHeadTrackerDevice.cpp
# Opt level: O3

VRInputDevice *
MinVR::VRFakeHeadTrackerDevice::create
          (VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  VRAnyCoreType VVar4;
  float *pfVar5;
  ostream *poVar6;
  VRFakeHeadTrackerDevice *this;
  VRMatrix4 M1;
  string devNameSpace;
  VRVector3 eye;
  VRVector3 up;
  VRVector3 center;
  VRVector3 z;
  VRMatrix4 headMatrix;
  VRVector3 x;
  VRMatrix4 lookAtMatrix;
  VRMatrix4 M2;
  VRVector3 y;
  string toggleEvent;
  string trackerName;
  undefined1 local_5e0 [72];
  long *local_598;
  long local_590;
  long local_588 [2];
  undefined1 local_578 [8];
  pointer pbStack_570;
  pointer local_568;
  undefined1 local_558 [8];
  pointer pbStack_550;
  pointer local_548;
  undefined1 local_538 [8];
  pointer pbStack_530;
  pointer local_528;
  undefined1 local_518 [8];
  pointer pbStack_510;
  pointer local_508;
  float local_4f8;
  float local_4f4;
  float local_4f0;
  float local_4ec;
  float local_4e8;
  float local_4e4;
  float local_4e0;
  float local_4dc;
  undefined1 local_4d8 [72];
  VRVector3 local_490;
  undefined1 local_478 [8];
  pointer pbStack_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468 [4];
  undefined1 local_428 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418 [4];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  pointer pbStack_3b0;
  pointer local_3a8;
  VRMainInterface *local_370;
  VRVector3 local_368;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  VRMatrix4 local_78;
  
  local_598 = local_588;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_370 = vrMain;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_598,pcVar2,pcVar2 + nameSpace->_M_string_length);
  pcVar2 = local_4d8 + 0x10;
  local_4d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"TrackerName","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_598,(long)local_598 + local_590);
  VVar4 = VRDataIndex::getValue(config,(string *)local_4d8,&local_150,true);
  (*(VVar4.datum)->_vptr_VRDatum[2])(&local_110,VVar4.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_4d8._0_8_ != pcVar2) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  local_4d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"ToggleOnOffEvent","");
  pcVar1 = local_5e0 + 0x10;
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"Kbd1_Down","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_598,(long)local_598 + local_590);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&local_130,config,(string *)local_4d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0,
             &local_170,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  if ((pointer)local_4d8._0_8_ != pcVar2) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  local_4d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"TranslationScale","");
  local_5e0._0_4_ = 0x3f800000;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_598,(long)local_598 + local_590);
  local_4dc = VRDataIndex::getValueWithDefault<float>
                        (config,(string *)local_4d8,(float *)local_5e0,&local_190,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_4d8._0_8_ != pcVar2) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  local_4d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"RotationScale","");
  local_5e0._0_4_ = 0x3f800000;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,local_598,(long)local_598 + local_590);
  local_4e0 = VRDataIndex::getValueWithDefault<float>
                        (config,(string *)local_4d8,(float *)local_5e0,&local_1b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_4d8._0_8_ != pcVar2) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  VRVector3::VRVector3((VRVector3 *)local_5e0,0.0,0.0,4.0);
  VRMatrix4::translation((VRMatrix4 *)local_4d8,(VRVector3 *)local_5e0);
  VRVector3::~VRVector3((VRVector3 *)local_5e0);
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"HeadMatrix","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_598,(long)local_598 + local_590);
  bVar3 = VRDataIndex::exists(config,(string *)local_5e0,&local_1d0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  if (bVar3) {
    local_428._0_8_ = local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"HeadMatrix","");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,local_598,(long)local_598 + local_590);
    VVar4 = VRDataIndex::getValue(config,(string *)local_428,&local_1f0,true);
    VRMatrix4::VRMatrix4((VRMatrix4 *)local_5e0,VVar4);
    VRMatrix4::operator=((VRMatrix4 *)local_4d8,(VRMatrix4 *)local_5e0);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)local_5e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._0_8_ != local_418) {
      operator_delete((void *)local_428._0_8_,local_418[0]._M_allocated_capacity + 1);
    }
  }
  else {
    local_5e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"LookAtUp","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_598,(long)local_598 + local_590);
    bVar3 = VRDataIndex::exists(config,(string *)local_5e0,&local_210,true);
    if (bVar3) {
      local_428._0_8_ = local_418;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"LookAtEye","");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_598,(long)local_598 + local_590);
      bVar3 = VRDataIndex::exists(config,(string *)local_428,&local_230,true);
      if (bVar3) {
        local_478 = (undefined1  [8])local_468;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"LookAtCenter","");
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,local_598,(long)local_598 + local_590);
        bVar3 = VRDataIndex::exists(config,(string *)local_478,&local_250,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (local_478 != (undefined1  [8])local_468) {
          operator_delete((void *)local_478,local_468[0]._M_allocated_capacity + 1);
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._0_8_ != local_418) {
        operator_delete((void *)local_428._0_8_,local_418[0]._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_5e0._0_8_ != pcVar1) {
      operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
    }
    if (bVar3 == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning : no HeadMatrix defined for ",0x24);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_598,local_590);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter",0x40);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Using default: ",0xf);
      poVar6 = operator<<((ostream *)&std::cerr,(VRMatrix4 *)local_4d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      local_5e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"LookAtUp","");
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_598,(long)local_598 + local_590);
      VVar4 = VRDataIndex::getValue(config,(string *)local_5e0,&local_270,true);
      VRVector3::VRVector3((VRVector3 *)local_558,VVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5e0._0_8_ != pcVar1) {
        operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
      }
      local_5e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"LookAtEye","");
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,local_598,(long)local_598 + local_590);
      VVar4 = VRDataIndex::getValue(config,(string *)local_5e0,&local_290,true);
      VRVector3::VRVector3((VRVector3 *)local_578,VVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5e0._0_8_ != pcVar1) {
        operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
      }
      local_5e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"LookAtCenter","");
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,local_598,(long)local_598 + local_590);
      VVar4 = VRDataIndex::getValue(config,(string *)local_5e0,&local_2b0,true);
      VRVector3::VRVector3((VRVector3 *)local_538,VVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_5e0._0_8_ != pcVar1) {
        operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
      }
      operator-((VRVector3 *)local_518,(VRVector3 *)local_578,(VRVector3 *)local_538);
      VRVector3::normalize((VRVector3 *)local_5e0,(VRVector3 *)local_518);
      VRVector3::operator=((VRVector3 *)local_518,(VRVector3 *)local_5e0);
      VRVector3::~VRVector3((VRVector3 *)local_5e0);
      VRVector3::cross(&local_490,(VRVector3 *)local_558,(VRVector3 *)local_518);
      VRVector3::normalize((VRVector3 *)local_5e0,&local_490);
      VRVector3::operator=(&local_490,(VRVector3 *)local_5e0);
      VRVector3::~VRVector3((VRVector3 *)local_5e0);
      VRVector3::cross(&local_368,(VRVector3 *)local_518,&local_490);
      pfVar5 = VRVector3::operator[](&local_490,0);
      local_3c8._0_4_ = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_368,0);
      local_3d8._0_4_ = *pfVar5;
      pfVar5 = VRVector3::operator[]((VRVector3 *)local_518,0);
      local_4e4 = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_490,1);
      local_4e8 = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_368,1);
      local_4ec = *pfVar5;
      pfVar5 = VRVector3::operator[]((VRVector3 *)local_518,1);
      local_4f0 = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_490,2);
      local_4f4 = *pfVar5;
      pfVar5 = VRVector3::operator[](&local_368,2);
      local_4f8 = *pfVar5;
      pfVar5 = VRVector3::operator[]((VRVector3 *)local_518,2);
      VRMatrix4::fromRowMajorElements
                ((VRMatrix4 *)local_5e0,(float)local_3c8._0_4_,(float)local_3d8._0_4_,local_4e4,0.0,
                 local_4e8,local_4ec,local_4f0,0.0,local_4f4,local_4f8,*pfVar5,0.0,0.0,0.0,0.0,1.0);
      pfVar5 = VRVector3::operator[]((VRVector3 *)local_578,0);
      local_3c8 = ZEXT416((uint)*pfVar5);
      pfVar5 = VRVector3::operator[]((VRVector3 *)local_578,1);
      local_3d8 = ZEXT416((uint)*pfVar5);
      pfVar5 = VRVector3::operator[]((VRVector3 *)local_578,2);
      VRMatrix4::fromRowMajorElements
                ((VRMatrix4 *)local_428,1.0,0.0,0.0,-(float)local_3c8._0_4_,0.0,1.0,0.0,
                 -(float)local_3d8._0_4_,0.0,0.0,1.0,-*pfVar5,0.0,0.0,0.0,1.0);
      operator*((VRMatrix4 *)local_478,(VRMatrix4 *)local_5e0,(VRMatrix4 *)local_428);
      VRMatrix4::inverse((VRMatrix4 *)local_3b8,(VRMatrix4 *)local_478);
      VRMatrix4::operator=((VRMatrix4 *)local_4d8,(VRMatrix4 *)local_3b8);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)local_3b8);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)local_478);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)local_428);
      VRMatrix4::~VRMatrix4((VRMatrix4 *)local_5e0);
      VRVector3::~VRVector3(&local_368);
      VRVector3::~VRVector3(&local_490);
      VRVector3::~VRVector3((VRVector3 *)local_518);
      VRVector3::~VRVector3((VRVector3 *)local_538);
      VRVector3::~VRVector3((VRVector3 *)local_578);
      VRVector3::~VRVector3((VRVector3 *)local_558);
    }
  }
  local_478 = (undefined1  [8])0x0;
  pbStack_470 = (pointer)0x0;
  local_468[0]._M_allocated_capacity = 0;
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"KbdUp","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"KbdW","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"ForwardKeys","");
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,local_598,(long)local_598 + local_590);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3b8,config,(string *)local_5e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_478,&local_2d0,true);
  local_418[0]._M_allocated_capacity = local_468[0]._M_allocated_capacity;
  local_428._8_8_ = pbStack_470;
  local_428._0_8_ = local_478;
  local_468[0]._M_allocated_capacity = local_3a8;
  local_478 = local_3b8;
  pbStack_470 = pbStack_3b0;
  local_3b8 = (undefined1  [8])0x0;
  pbStack_3b0 = (pointer)0x0;
  local_3a8 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_3b8 = (undefined1  [8])0x0;
  pbStack_3b0 = (pointer)0x0;
  local_3a8 = (pointer)0x0;
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"KbdDown","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"KbdZ","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"BackKeys","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_598,(long)local_598 + local_590);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_558,config,(string *)local_5e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3b8,&local_2f0,true);
  local_418[0]._0_8_ = local_3a8;
  local_428._8_8_ = pbStack_3b0;
  local_428._0_8_ = local_3b8;
  local_3a8 = local_548;
  local_3b8 = local_558;
  pbStack_3b0 = pbStack_550;
  local_558 = (undefined1  [8])0x0;
  pbStack_550 = (pointer)0x0;
  local_548 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_558);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_558 = (undefined1  [8])0x0;
  pbStack_550 = (pointer)0x0;
  local_548 = (pointer)0x0;
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"KbdLeft","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_558,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"KbdA","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_558,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"LeftKeys","");
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_598,(long)local_598 + local_590);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_578,config,(string *)local_5e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_558,&local_310,true);
  local_418[0]._0_8_ = local_548;
  local_428._8_8_ = pbStack_550;
  local_428._0_8_ = local_558;
  local_548 = local_568;
  local_558 = local_578;
  pbStack_550 = pbStack_570;
  local_578 = (undefined1  [8])0x0;
  pbStack_570 = (pointer)0x0;
  local_568 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_578 = (undefined1  [8])0x0;
  pbStack_570 = (pointer)0x0;
  local_568 = (pointer)0x0;
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"KbdRight","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"KbdS","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"RightKeys","");
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,local_598,(long)local_598 + local_590);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_538,config,(string *)local_5e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_578,&local_330,true);
  local_418[0]._0_8_ = local_568;
  local_428._8_8_ = pbStack_570;
  local_428._0_8_ = local_578;
  local_568 = local_528;
  local_578 = local_538;
  pbStack_570 = pbStack_530;
  local_538 = (undefined1  [8])0x0;
  pbStack_530 = (pointer)0x0;
  local_528 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_538 = (undefined1  [8])0x0;
  pbStack_530 = (pointer)0x0;
  local_528 = (pointer)0x0;
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"MouseBtnRight","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_538,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  local_5e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"MouseRotationKeys","");
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,local_598,(long)local_598 + local_590);
  VRDataIndex::
  getValueWithDefault<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_518,config,(string *)local_5e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_538,&local_350,true);
  local_418[0]._0_8_ = local_528;
  local_428._8_8_ = pbStack_530;
  local_428._0_8_ = local_538;
  local_528 = local_508;
  local_538 = local_518;
  pbStack_530 = pbStack_510;
  local_518 = (undefined1  [8])0x0;
  pbStack_510 = (pointer)0x0;
  local_508 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_5e0._0_8_ != pcVar1) {
    operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
  }
  this = (VRFakeHeadTrackerDevice *)operator_new(0x1b0);
  VRMatrix4::VRMatrix4(&local_78,(VRMatrix4 *)local_4d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_478);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_558);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_538);
  VRFakeHeadTrackerDevice
            (this,&local_110,&local_130,local_4dc,local_4e0,&local_78,&local_d8,&local_f0,&local_90,
             &local_a8,&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  VRMatrix4::~VRMatrix4(&local_78);
  (**local_370->_vptr_VRMainInterface)(local_370,&this->super_VREventHandler);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_538);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_558);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_478);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_598 != local_588) {
    operator_delete(local_598,local_588[0] + 1);
  }
  return &this->super_VRInputDevice;
}

Assistant:

VRInputDevice*
VRFakeHeadTrackerDevice::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {
    std::string devNameSpace = nameSpace;
  
    std::string trackerName = config->getValue("TrackerName", devNameSpace);
    std::string toggleEvent = config->getValueWithDefault("ToggleOnOffEvent", std::string("Kbd1_Down"), devNameSpace);
    float tScale = config->getValueWithDefault("TranslationScale", 1.0f, devNameSpace);
    float rScale = config->getValueWithDefault("RotationScale", 1.0f, devNameSpace);
    
    VRMatrix4 headMatrix = VRMatrix4::translation(VRVector3(0,0,4));
    if (config->exists("HeadMatrix", devNameSpace)){
        headMatrix = config->getValue("HeadMatrix", devNameSpace);
    }
    else if (config->exists("LookAtUp", devNameSpace) && config->exists("LookAtEye", devNameSpace) && config->exists("LookAtCenter", devNameSpace))
    {
        VRVector3 up = config->getValue("LookAtUp", devNameSpace);
        VRVector3 eye = config->getValue("LookAtEye", devNameSpace);
        VRVector3 center = config->getValue("LookAtCenter", devNameSpace);
        
        VRVector3 z = eye - center;
        z = z.normalize();
        VRVector3 x = up.cross(z);
        x = x.normalize();
        VRVector3 y = z.cross(x);
        
        VRMatrix4 M1 = VRMatrix4::fromRowMajorElements(x[0], y[0], z[0], 0,
                                                       x[1], y[1], z[1], 0,
                                                       x[2], y[2], z[2], 0,
                                                       0, 0, 0, 1);
        
        VRMatrix4 M2 = VRMatrix4::fromRowMajorElements(1, 0, 0, -eye[0],
                                                       0, 1, 0, -eye[1],
                                                       0, 0, 1, -eye[2],
                                                       0, 0, 0, 1);
        
        VRMatrix4 lookAtMatrix = M1 * M2;
        headMatrix = lookAtMatrix.inverse();
    }
    else {
        std::cerr << "Warning : no HeadMatrix defined for " << devNameSpace << std::endl;
        std::cerr << "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter" << std::endl;
        std::cerr << "Using default: " << headMatrix << std::endl;
    }
    
    std::vector<std::string> forwardKeys;
    forwardKeys.push_back("KbdUp");
    forwardKeys.push_back("KbdW");
    forwardKeys = config->getValueWithDefault("ForwardKeys", forwardKeys, devNameSpace);
    
    std::vector<std::string> backKeys;
    backKeys.push_back("KbdDown");
    backKeys.push_back("KbdZ");
    backKeys = config->getValueWithDefault("BackKeys", backKeys, devNameSpace);
    
    std::vector<std::string> leftKeys;
    leftKeys.push_back("KbdLeft");
    leftKeys.push_back("KbdA");
    leftKeys = config->getValueWithDefault("LeftKeys", leftKeys, devNameSpace);
    
    std::vector<std::string> rightKeys;
    rightKeys.push_back("KbdRight");
    rightKeys.push_back("KbdS");
    rightKeys = config->getValueWithDefault("RightKeys", rightKeys, devNameSpace);

    std::vector<std::string> mouseRotKeys;
    mouseRotKeys.push_back("MouseBtnRight");
    mouseRotKeys = config->getValueWithDefault("MouseRotationKeys", mouseRotKeys, devNameSpace);
    
    VRFakeHeadTrackerDevice *dev = new VRFakeHeadTrackerDevice(trackerName, toggleEvent, tScale, rScale,
        headMatrix, forwardKeys, backKeys, leftKeys, rightKeys, mouseRotKeys);
    vrMain->addEventHandler(dev);

    return dev;
}